

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Struct.cpp
# Opt level: O0

void __thiscall
soul::Structure::updateMemberType(Structure *this,string_view memberName,Type *newType)

{
  size_t index_00;
  Member *this_00;
  size_t index;
  Type *newType_local;
  Structure *this_local;
  string_view memberName_local;
  
  index_00 = getMemberIndex(this,memberName);
  this_00 = ArrayWithPreallocation<soul::Structure::Member,_8UL>::operator[]
                      (&this->members,index_00);
  Type::operator=(&this_00->type,newType);
  return;
}

Assistant:

void Structure::updateMemberType (std::string_view memberName, const Type& newType)
{
    auto index = getMemberIndex (memberName);
    members[index].type = newType;
}